

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O3

void duckdb::RepeatListFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  idx_t *piVar4;
  long *plVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  idx_t iVar8;
  sel_t *psVar9;
  sel_t *psVar10;
  data_ptr_t pdVar11;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar13;
  element_type *peVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  reference vector;
  reference vector_00;
  Vector *source;
  Vector *target;
  idx_t iVar16;
  long lVar17;
  TemplatedValidityData<unsigned_long> *pTVar18;
  _Head_base<0UL,_unsigned_long_*,_false> _Var19;
  idx_t iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  idx_t iVar28;
  ulong uVar29;
  idx_t iVar30;
  long lVar31;
  idx_t iVar32;
  UnifiedVectorFormat ldata;
  ulong local_f8;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  ulong local_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  source = ListVector::GetEntry(vector);
  target = ListVector::GetEntry(result);
  iVar16 = ListVector::GetListSize(result);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    piVar4 = (idx_t *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      iVar8 = *(idx_t *)((long)vector->data + 8);
      lVar31 = *(long *)vector_00->data;
      lVar26 = 0;
      if (iVar8 != 0 && 0 < lVar31) {
        lVar26 = lVar31;
      }
      iVar28 = *(idx_t *)vector->data;
      ListVector::Reserve(result,iVar16 + lVar26 * iVar8);
      iVar32 = iVar16;
      if (iVar8 != 0 && 0 < lVar31) {
        do {
          VectorOperations::Copy(source,target,iVar8 + iVar28,iVar28,iVar32);
          iVar32 = iVar32 + iVar8;
          lVar31 = lVar31 + -1;
        } while (lVar31 != 0);
      }
      *piVar4 = iVar16;
      piVar4[1] = lVar26 * iVar8;
      iVar16 = iVar32;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
    goto LAB_01044f4c;
  }
  iVar8 = args->count;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
    plVar5 = (long *)vector_00->data;
    puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar6 = vector->data;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar7 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (iVar8 != 0) {
          lVar31 = *plVar5;
          iVar32 = 0;
          iVar28 = iVar16;
          do {
            lVar24 = iVar32 * 0x10;
            iVar20 = *(idx_t *)(pdVar6 + lVar24);
            lVar26 = *(long *)(pdVar6 + lVar24 + 8);
            lVar17 = 0;
            if (lVar26 != 0 && 0 < lVar31) {
              lVar17 = lVar31;
            }
            ListVector::Reserve(result,iVar28 + lVar17 * lVar26);
            iVar16 = iVar28;
            if (lVar26 != 0 && 0 < lVar31) {
              lVar27 = lVar31;
              do {
                VectorOperations::Copy(source,target,lVar26 + iVar20,iVar20,iVar16);
                iVar16 = iVar16 + lVar26;
                lVar27 = lVar27 + -1;
              } while (lVar27 != 0);
            }
            *(idx_t *)(pdVar7 + lVar24) = iVar28;
            *(long *)(pdVar7 + lVar24 + 8) = lVar17 * lVar26;
            iVar32 = iVar32 + 1;
            iVar28 = iVar16;
          } while (iVar32 != iVar8);
        }
      }
      else if (0x3f < iVar8 + 0x3f) {
        uVar29 = 0;
        local_f8 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar22 = uVar29 + 0x40;
            if (iVar8 <= uVar29 + 0x40) {
              uVar22 = iVar8;
            }
LAB_01044d2e:
            uVar12 = uVar29;
            if (uVar29 < uVar22) {
              lVar31 = *plVar5;
              iVar28 = iVar16;
              do {
                lVar24 = uVar29 * 0x10;
                iVar32 = *(idx_t *)(pdVar6 + lVar24);
                lVar26 = *(long *)(pdVar6 + lVar24 + 8);
                lVar17 = 0;
                if (lVar26 != 0 && 0 < lVar31) {
                  lVar17 = lVar31;
                }
                ListVector::Reserve(result,lVar17 * lVar26 + iVar28);
                iVar16 = iVar28;
                if (lVar26 != 0 && 0 < lVar31) {
                  lVar27 = lVar31;
                  do {
                    VectorOperations::Copy(source,target,lVar26 + iVar32,iVar32,iVar16);
                    iVar16 = iVar16 + lVar26;
                    lVar27 = lVar27 + -1;
                  } while (lVar27 != 0);
                }
                *(idx_t *)(pdVar7 + lVar24) = iVar28;
                *(long *)(pdVar7 + lVar24 + 8) = lVar17 * lVar26;
                uVar29 = uVar29 + 1;
                uVar12 = uVar22;
                iVar28 = iVar16;
              } while (uVar29 != uVar22);
            }
          }
          else {
            uVar23 = puVar3[local_f8];
            uVar22 = uVar29 + 0x40;
            if (iVar8 <= uVar29 + 0x40) {
              uVar22 = iVar8;
            }
            uVar12 = uVar22;
            if (uVar23 != 0) {
              if (uVar23 == 0xffffffffffffffff) goto LAB_01044d2e;
              uVar25 = uVar29;
              iVar28 = iVar16;
              uVar12 = uVar29;
              if (uVar29 < uVar22) {
                do {
                  iVar16 = iVar28;
                  if ((uVar23 >> ((ulong)(uint)((int)uVar25 - (int)uVar29) & 0x3f) & 1) != 0) {
                    lVar24 = uVar25 * 0x10;
                    iVar32 = *(idx_t *)(pdVar6 + lVar24);
                    lVar31 = *(long *)(pdVar6 + lVar24 + 8);
                    lVar26 = *plVar5;
                    lVar17 = 0;
                    if (lVar31 != 0 && 0 < lVar26) {
                      lVar17 = lVar26;
                    }
                    ListVector::Reserve(result,lVar17 * lVar31 + iVar28);
                    if (lVar31 != 0 && 0 < lVar26) {
                      do {
                        VectorOperations::Copy(source,target,lVar31 + iVar32,iVar32,iVar16);
                        iVar16 = iVar16 + lVar31;
                        lVar26 = lVar26 + -1;
                      } while (lVar26 != 0);
                    }
                    *(idx_t *)(pdVar7 + lVar24) = iVar28;
                    *(long *)(pdVar7 + lVar24 + 8) = lVar17 * lVar31;
                  }
                  uVar25 = uVar25 + 1;
                  iVar28 = iVar16;
                  uVar12 = uVar22;
                } while (uVar25 != uVar22);
              }
            }
          }
          uVar29 = uVar12;
          local_f8 = local_f8 + 1;
        } while (local_f8 != iVar8 + 0x3f >> 6);
      }
      goto LAB_01044f4c;
    }
  }
  else {
    if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
      if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
        pdVar6 = vector->data;
        pdVar7 = vector_00->data;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar11 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        FlatVector::VerifyFlatVector(vector_00);
        ValidityMask::Combine(&result->validity,&vector_00->validity,iVar8);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar8 != 0) {
            iVar32 = 0;
            iVar28 = iVar16;
            do {
              lVar24 = iVar32 * 0x10;
              iVar20 = *(idx_t *)(pdVar6 + lVar24);
              lVar31 = *(long *)(pdVar6 + lVar24 + 8);
              lVar26 = *(long *)(pdVar7 + iVar32 * 8);
              lVar17 = 0;
              if (lVar31 != 0 && 0 < lVar26) {
                lVar17 = lVar26;
              }
              ListVector::Reserve(result,lVar17 * lVar31 + iVar28);
              iVar16 = iVar28;
              if (lVar31 != 0 && 0 < lVar26) {
                do {
                  VectorOperations::Copy(source,target,lVar31 + iVar20,iVar20,iVar16);
                  iVar16 = iVar16 + lVar31;
                  lVar26 = lVar26 + -1;
                } while (lVar26 != 0);
              }
              *(idx_t *)(pdVar11 + lVar24) = iVar28;
              *(long *)(pdVar11 + lVar24 + 8) = lVar17 * lVar31;
              iVar32 = iVar32 + 1;
              iVar28 = iVar16;
            } while (iVar32 != iVar8);
          }
        }
        else if (0x3f < iVar8 + 0x3f) {
          local_d0 = iVar8 + 0x3f >> 6;
          uVar22 = 0;
          uVar29 = 0;
          do {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar23 = uVar29 + 0x40;
              if (iVar8 <= uVar29 + 0x40) {
                uVar23 = iVar8;
              }
LAB_0104571c:
              uVar25 = uVar29;
              iVar28 = iVar16;
              if (uVar29 < uVar23) {
                do {
                  lVar24 = uVar29 * 0x10;
                  iVar32 = *(idx_t *)(pdVar6 + lVar24);
                  lVar31 = *(long *)(pdVar6 + lVar24 + 8);
                  lVar26 = *(long *)(pdVar7 + uVar29 * 8);
                  lVar17 = 0;
                  if (lVar31 != 0 && 0 < lVar26) {
                    lVar17 = lVar26;
                  }
                  ListVector::Reserve(result,lVar17 * lVar31 + iVar28);
                  iVar16 = iVar28;
                  if (lVar31 != 0 && 0 < lVar26) {
                    do {
                      VectorOperations::Copy(source,target,lVar31 + iVar32,iVar32,iVar16);
                      iVar16 = iVar16 + lVar31;
                      lVar26 = lVar26 + -1;
                    } while (lVar26 != 0);
                  }
                  *(idx_t *)(pdVar11 + lVar24) = iVar28;
                  *(long *)(pdVar11 + lVar24 + 8) = lVar17 * lVar31;
                  uVar29 = uVar29 + 1;
                  uVar25 = uVar23;
                  iVar28 = iVar16;
                } while (uVar29 != uVar23);
              }
            }
            else {
              uVar12 = puVar3[uVar22];
              uVar23 = uVar29 + 0x40;
              if (iVar8 <= uVar29 + 0x40) {
                uVar23 = iVar8;
              }
              uVar25 = uVar23;
              if (uVar12 != 0) {
                if (uVar12 == 0xffffffffffffffff) goto LAB_0104571c;
                uVar21 = uVar29;
                uVar25 = uVar29;
                iVar28 = iVar16;
                if (uVar29 < uVar23) {
                  do {
                    iVar16 = iVar28;
                    if ((uVar12 >> ((ulong)(uint)((int)uVar21 - (int)uVar29) & 0x3f) & 1) != 0) {
                      lVar24 = uVar21 * 0x10;
                      iVar32 = *(idx_t *)(pdVar6 + lVar24);
                      lVar31 = *(long *)(pdVar6 + lVar24 + 8);
                      lVar26 = *(long *)(pdVar7 + uVar21 * 8);
                      lVar17 = 0;
                      if (lVar31 != 0 && 0 < lVar26) {
                        lVar17 = lVar26;
                      }
                      ListVector::Reserve(result,lVar17 * lVar31 + iVar28);
                      if (lVar31 != 0 && 0 < lVar26) {
                        do {
                          VectorOperations::Copy(source,target,lVar31 + iVar32,iVar32,iVar16);
                          iVar16 = iVar16 + lVar31;
                          lVar26 = lVar26 + -1;
                        } while (lVar26 != 0);
                      }
                      *(idx_t *)(pdVar11 + lVar24) = iVar28;
                      *(long *)(pdVar11 + lVar24 + 8) = lVar17 * lVar31;
                    }
                    uVar21 = uVar21 + 1;
                    uVar25 = uVar23;
                    iVar28 = iVar16;
                  } while (uVar21 != uVar23);
                }
              }
            }
            uVar22 = uVar22 + 1;
            uVar29 = uVar25;
          } while (uVar22 != local_d0);
        }
      }
      else {
        UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
        Vector::ToUnifiedFormat(vector,iVar8,&local_78);
        Vector::ToUnifiedFormat(vector_00,iVar8,&local_c0);
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 &&
            local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar8 != 0) {
            psVar9 = (local_78.sel)->sel_vector;
            psVar10 = (local_c0.sel)->sel_vector;
            iVar32 = 0;
            iVar28 = iVar16;
            do {
              iVar16 = iVar32;
              if (psVar9 != (sel_t *)0x0) {
                iVar16 = (idx_t)psVar9[iVar32];
              }
              iVar20 = iVar32;
              if (psVar10 != (sel_t *)0x0) {
                iVar20 = (idx_t)psVar10[iVar32];
              }
              iVar30 = *(idx_t *)(local_78.data + iVar16 * 0x10);
              lVar31 = *(long *)(local_78.data + iVar16 * 0x10 + 8);
              lVar26 = *(long *)(local_c0.data + iVar20 * 8);
              lVar17 = 0;
              if (lVar31 != 0 && 0 < lVar26) {
                lVar17 = lVar26;
              }
              ListVector::Reserve(result,lVar17 * lVar31 + iVar28);
              iVar16 = iVar28;
              if (lVar31 != 0 && 0 < lVar26) {
                do {
                  VectorOperations::Copy(source,target,lVar31 + iVar30,iVar30,iVar16);
                  iVar16 = iVar16 + lVar31;
                  lVar26 = lVar26 + -1;
                } while (lVar26 != 0);
              }
              *(idx_t *)(pdVar6 + iVar32 * 0x10) = iVar28;
              *(long *)(pdVar6 + iVar32 * 0x10 + 8) = lVar17 * lVar31;
              iVar32 = iVar32 + 1;
              iVar28 = iVar16;
            } while (iVar32 != iVar8);
          }
        }
        else if (iVar8 != 0) {
          psVar9 = (local_78.sel)->sel_vector;
          psVar10 = (local_c0.sel)->sel_vector;
          uVar29 = 0;
          do {
            uVar22 = uVar29;
            if (psVar9 != (sel_t *)0x0) {
              uVar22 = (ulong)psVar9[uVar29];
            }
            uVar23 = uVar29;
            if (psVar10 != (sel_t *)0x0) {
              uVar23 = (ulong)psVar10[uVar29];
            }
            if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) ||
                ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) &&
               ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0 ||
                ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0)))) {
              iVar28 = *(idx_t *)(local_78.data + uVar22 * 0x10);
              lVar31 = *(long *)(local_78.data + uVar22 * 0x10 + 8);
              lVar26 = *(long *)(local_c0.data + uVar23 * 8);
              lVar17 = 0;
              if (lVar31 != 0 && 0 < lVar26) {
                lVar17 = lVar26;
              }
              ListVector::Reserve(result,lVar17 * lVar31 + iVar16);
              iVar32 = iVar16;
              if (lVar31 != 0 && 0 < lVar26) {
                do {
                  VectorOperations::Copy(source,target,lVar31 + iVar28,iVar28,iVar32);
                  iVar32 = iVar32 + lVar31;
                  lVar26 = lVar26 + -1;
                } while (lVar26 != 0);
              }
              *(idx_t *)(pdVar6 + uVar29 * 0x10) = iVar16;
              *(long *)(pdVar6 + uVar29 * 0x10 + 8) = lVar17 * lVar31;
              iVar16 = iVar32;
            }
            else {
              _Var19._M_head_impl =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var19._M_head_impl == (unsigned_long *)0x0) {
                local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_e8,&local_c8);
                p_Var15 = p_Stack_e0;
                peVar14 = local_e8;
                local_e8 = (element_type *)0x0;
                p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar14;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var15;
                if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                   p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                _Var19._M_head_impl =
                     (pTVar18->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var19._M_head_impl;
              }
              bVar13 = (byte)uVar29 & 0x3f;
              _Var19._M_head_impl[uVar29 >> 6] =
                   _Var19._M_head_impl[uVar29 >> 6] &
                   (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != iVar8);
        }
        if (local_c0.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_78.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      goto LAB_01044f4c;
    }
    piVar4 = (idx_t *)vector->data;
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar6 = vector_00->data;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar7 = result->data;
      FlatVector::VerifyFlatVector(result);
      FlatVector::VerifyFlatVector(vector_00);
      FlatVector::VerifyFlatVector(result);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (iVar8 != 0) {
          iVar28 = *piVar4;
          iVar32 = piVar4[1];
          iVar30 = 0;
          iVar20 = iVar16;
          do {
            lVar31 = *(long *)(pdVar6 + iVar30 * 8);
            lVar26 = 0;
            if (0 < lVar31 && iVar32 != 0) {
              lVar26 = lVar31;
            }
            ListVector::Reserve(result,lVar26 * iVar32 + iVar20);
            iVar16 = iVar20;
            if (0 < lVar31 && iVar32 != 0) {
              do {
                VectorOperations::Copy(source,target,iVar32 + iVar28,iVar28,iVar16);
                iVar16 = iVar16 + iVar32;
                lVar31 = lVar31 + -1;
              } while (lVar31 != 0);
            }
            *(idx_t *)(pdVar7 + iVar30 * 0x10) = iVar20;
            *(idx_t *)(pdVar7 + iVar30 * 0x10 + 8) = lVar26 * iVar32;
            iVar30 = iVar30 + 1;
            iVar20 = iVar16;
          } while (iVar30 != iVar8);
        }
      }
      else if (0x3f < iVar8 + 0x3f) {
        uVar29 = 0;
        local_f8 = 0;
        do {
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar22 = uVar29 + 0x40;
            if (iVar8 <= uVar29 + 0x40) {
              uVar22 = iVar8;
            }
LAB_010452e5:
            uVar12 = uVar29;
            if (uVar29 < uVar22) {
              iVar28 = *piVar4;
              iVar32 = piVar4[1];
              iVar20 = iVar16;
              do {
                lVar31 = *(long *)(pdVar6 + uVar29 * 8);
                lVar26 = 0;
                if (0 < lVar31 && iVar32 != 0) {
                  lVar26 = lVar31;
                }
                ListVector::Reserve(result,lVar26 * iVar32 + iVar20);
                iVar16 = iVar20;
                if (0 < lVar31 && iVar32 != 0) {
                  do {
                    VectorOperations::Copy(source,target,iVar32 + iVar28,iVar28,iVar16);
                    iVar16 = iVar16 + iVar32;
                    lVar31 = lVar31 + -1;
                  } while (lVar31 != 0);
                }
                *(idx_t *)(pdVar7 + uVar29 * 0x10) = iVar20;
                *(idx_t *)(pdVar7 + uVar29 * 0x10 + 8) = lVar26 * iVar32;
                uVar29 = uVar29 + 1;
                uVar12 = uVar22;
                iVar20 = iVar16;
              } while (uVar29 != uVar22);
            }
          }
          else {
            uVar23 = puVar3[local_f8];
            uVar22 = uVar29 + 0x40;
            if (iVar8 <= uVar29 + 0x40) {
              uVar22 = iVar8;
            }
            uVar12 = uVar22;
            if (uVar23 != 0) {
              if (uVar23 == 0xffffffffffffffff) goto LAB_010452e5;
              iVar28 = iVar16;
              uVar12 = uVar29;
              uVar25 = uVar29;
              if (uVar29 < uVar22) {
                do {
                  iVar16 = iVar28;
                  if ((uVar23 >> ((ulong)(uint)((int)uVar25 - (int)uVar29) & 0x3f) & 1) != 0) {
                    iVar32 = *piVar4;
                    iVar20 = piVar4[1];
                    lVar31 = *(long *)(pdVar6 + uVar25 * 8);
                    lVar26 = 0;
                    if (iVar20 != 0 && 0 < lVar31) {
                      lVar26 = lVar31;
                    }
                    ListVector::Reserve(result,lVar26 * iVar20 + iVar28);
                    if (iVar20 != 0 && 0 < lVar31) {
                      do {
                        VectorOperations::Copy(source,target,iVar20 + iVar32,iVar32,iVar16);
                        iVar16 = iVar16 + iVar20;
                        lVar31 = lVar31 + -1;
                      } while (lVar31 != 0);
                    }
                    *(idx_t *)(pdVar7 + uVar25 * 0x10) = iVar28;
                    *(idx_t *)(pdVar7 + uVar25 * 0x10 + 8) = lVar26 * iVar20;
                  }
                  uVar25 = uVar25 + 1;
                  iVar28 = iVar16;
                  uVar12 = uVar22;
                } while (uVar25 != uVar22);
              }
            }
          }
          uVar29 = uVar12;
          local_f8 = local_f8 + 1;
        } while (local_f8 != iVar8 + 0x3f >> 6);
      }
      goto LAB_01044f4c;
    }
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  ConstantVector::SetNull(result,true);
LAB_01044f4c:
  ListVector::SetListSize(result,iVar16);
  return;
}

Assistant:

static void RepeatListFunction(DataChunk &args, ExpressionState &, Vector &result) {
	auto &list_vector = args.data[0];
	auto &cnt_vector = args.data[1];

	auto &source_child = ListVector::GetEntry(list_vector);
	auto &result_child = ListVector::GetEntry(result);

	idx_t current_size = ListVector::GetListSize(result);
	BinaryExecutor::Execute<list_entry_t, int64_t, list_entry_t>(
	    list_vector, cnt_vector, result, args.size(), [&](list_entry_t list_input, int64_t cnt) {
		    idx_t copy_count = cnt <= 0 || list_input.length == 0 ? 0 : UnsafeNumericCast<idx_t>(cnt);
		    idx_t result_length = list_input.length * copy_count;
		    idx_t new_size = current_size + result_length;
		    ListVector::Reserve(result, new_size);
		    list_entry_t result_list;
		    result_list.offset = current_size;
		    result_list.length = result_length;
		    for (idx_t i = 0; i < copy_count; i++) {
			    // repeat the list contents "cnt" times
			    VectorOperations::Copy(source_child, result_child, list_input.offset + list_input.length,
			                           list_input.offset, current_size);
			    current_size += list_input.length;
		    }
		    return result_list;
	    });
	ListVector::SetListSize(result, current_size);
}